

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *p,uint *pPat)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint *p_00;
  int local_28;
  int Limit;
  int i;
  int f;
  Aig_Obj_t *pObj;
  uint *pPat_local;
  Ssw_Sml_t *p_local;
  
  if (p->nFrames < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswSim.c"
                  ,0x2a6,"void Ssw_SmlAssignDist1Plus(Ssw_Sml_t *, unsigned int *)");
  }
  for (local_28 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_28 < iVar1; local_28 = local_28 + 1)
  {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_28);
    iVar1 = Abc_InfoHasBit(pPat,local_28);
    Ssw_SmlObjAssignConst(p,pAVar2,iVar1,0);
  }
  iVar1 = Saig_ManPiNum(p->pAig);
  iVar1 = Abc_MinInt(iVar1,p->nWordsFrame * 0x20 + -1);
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    pAVar2 = Aig_ManCi(p->pAig,local_28);
    p_00 = Ssw_ObjSim(p,pAVar2->Id);
    Abc_InfoXorBit(p_00,local_28 + 1);
  }
  for (Limit = 1; Limit < p->nFrames; Limit = Limit + 1) {
    for (local_28 = 0; iVar1 = Saig_ManPiNum(p->pAig), local_28 < iVar1; local_28 = local_28 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_28);
      Ssw_SmlAssignRandomFrame(p,pAVar2,Limit);
    }
  }
  return;
}

Assistant:

void Ssw_SmlAssignDist1Plus( Ssw_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, Limit;
    assert( p->nFrames > 0 );

    // copy the pattern into the primary inputs
    Aig_ManForEachCi( p->pAig, pObj, i )
        Ssw_SmlObjAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );

    // set distance one PIs for the first frame
    Limit = Abc_MinInt( Saig_ManPiNum(p->pAig), p->nWordsFrame * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Abc_InfoXorBit( Ssw_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ), i+1 );

    // create random info for the remaining timeframes
    for ( f = 1; f < p->nFrames; f++ )
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p, pObj, f );
}